

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_at_last_by_stl_str_view_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void> *this
          ,char *testcase,char *name,size_t index)

{
  TestCase *pTVar1;
  
  pTVar1 = AddTestCase(testcase,index);
  (this->m_mediator).super_iuITestCaseMediator.m_test_case = pTVar1;
  (this->m_mediator).super_iuITestCaseMediator._vptr_iuITestCaseMediator =
       (_func_int **)&PTR__iuITestCaseMediator_00263be0;
  TestInfo::TestInfo(&this->m_info,(iuITestCaseMediator *)this,name,
                     &(this->m_factory).super_iuFactoryBase);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_00273400;
  TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_at_last_by_stl_str_view_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
  ::EachTest<iutest::detail::VariadicTypeList<wchar_t,_char16_t,_char32_t>,_void>::EachTest
            (&this->m_next,testcase,name,index + 1);
  return;
}

Assistant:

EachTest(const char* testcase, const char* name, size_t index)
            : m_mediator(AddTestCase(testcase, index))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testcase, name, index+1)
        {
        }